

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_fma_functor::binary_op_div>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  __m128 _outp_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _p;
  __m256 _b_256;
  __m128 _b_128;
  int i;
  float b;
  binary_op_div op;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  int local_1bc;
  float *local_1a8;
  undefined1 (*local_198) [32];
  
  fVar1 = *in_RSI;
  local_1bc = 0;
  if (in_R8D == 4) {
    local_270 = *(undefined8 *)in_RSI;
    uStack_268 = *(undefined8 *)(in_RSI + 2);
  }
  else {
    local_270 = CONCAT44(fVar1,fVar1);
    uStack_268 = CONCAT44(fVar1,fVar1);
  }
  local_1a8 = in_RDX;
  local_198 = in_RDI;
  if (in_R8D == 8) {
    local_2a0 = *(undefined8 *)in_RSI;
    uStack_298 = *(undefined8 *)(in_RSI + 2);
    uStack_290 = *(undefined8 *)(in_RSI + 4);
    uStack_288 = *(undefined8 *)(in_RSI + 6);
  }
  else {
    local_2a0 = local_270;
    uStack_298 = uStack_268;
    uStack_290 = local_270;
    uStack_288 = uStack_268;
  }
  for (; local_1bc + 7 < in_ECX; local_1bc = local_1bc + 8) {
    auVar3._8_8_ = uStack_298;
    auVar3._0_8_ = local_2a0;
    auVar3._16_8_ = uStack_290;
    auVar3._24_8_ = uStack_288;
    auVar3 = vdivps_avx(*local_198,auVar3);
    local_240 = auVar3._0_8_;
    uStack_238 = auVar3._8_8_;
    uStack_230 = auVar3._16_8_;
    uStack_228 = auVar3._24_8_;
    *(undefined8 *)local_1a8 = local_240;
    *(undefined8 *)(local_1a8 + 2) = uStack_238;
    *(undefined8 *)(local_1a8 + 4) = uStack_230;
    *(undefined8 *)(local_1a8 + 6) = uStack_228;
    local_198 = local_198 + 1;
    local_1a8 = local_1a8 + 8;
  }
  for (; local_1bc + 3 < in_ECX; local_1bc = local_1bc + 4) {
    auVar2._8_8_ = uStack_268;
    auVar2._0_8_ = local_270;
    auVar2 = vdivps_avx(*(undefined1 (*) [16])*local_198,auVar2);
    local_260 = auVar2._0_8_;
    uStack_258 = auVar2._8_8_;
    *(undefined8 *)local_1a8 = local_260;
    *(undefined8 *)(local_1a8 + 2) = uStack_258;
    local_198 = (undefined1 (*) [32])(*local_198 + 0x10);
    local_1a8 = local_1a8 + 4;
  }
  for (; local_1bc < in_ECX; local_1bc = local_1bc + 1) {
    *local_1a8 = *(float *)*local_198 / fVar1;
    local_198 = (undefined1 (*) [32])(*local_198 + 4);
    local_1a8 = local_1a8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_b(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float b = *ptr1;

    int i = 0;
#if __SSE2__
    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps(ptr1) : _mm_set1_ps(b);
#if __AVX__
    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps(ptr1) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps(ptr1) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_256);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b_128);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, b);
        ptr += 1;
        outptr += 1;
    }
}